

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeComputeTests.cpp
# Opt level: O1

void deqp::gles31::Functional::NegativeTestShared::anon_unknown_0::exceed_uniform_components_limit
               (NegativeTestContext *ctx)

{
  RenderContext *renderCtx;
  undefined4 uVar1;
  ostream *poVar2;
  long lVar3;
  ostringstream shaderBody;
  ostringstream shaderDecl;
  ShaderProgram program;
  string local_538;
  string local_518;
  string local_4f8;
  uint local_4d8;
  value_type local_4d0;
  undefined1 local_4b0 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4a0 [4];
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_420;
  undefined1 local_400 [32];
  undefined1 local_3e0 [376];
  undefined1 local_268 [376];
  ShaderProgram local_f0;
  
  local_268._0_4_ = 0;
  glu::CallLogWrapper::glGetIntegerv(&ctx->super_CallLogWrapper,0x8263,(GLint *)local_268);
  uVar1 = local_268._0_4_;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_268);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3e0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_268,"uniform highp uint u_value[",0x1b);
  poVar2 = (ostream *)std::ostream::operator<<(local_268,uVar1 + 1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"];\n",3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,"layout(binding = 0) buffer Output {\n",0x24);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"    uint values[2];\n",0x14);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"} sb_out;\n",10);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_3e0,"    sb_out.values[0] = u_value[",0x1f);
  poVar2 = (ostream *)std::ostream::operator<<(local_3e0,uVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"];\n",3);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_3e0,"    sb_out.values[1] = u_value[0];\n",0x23);
  renderCtx = ctx->m_renderCtx;
  local_400[0x10] = 0;
  local_400._17_8_ = 0;
  local_400._0_8_ = (pointer)0x0;
  local_400[8] = 0;
  local_400._9_7_ = 0;
  memset(local_4b0,0,0xac);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringbuf::str();
  generateComputeShader(&local_538,ctx,&local_4f8,&local_518);
  local_4d8 = 5;
  local_4d0._M_dataplus._M_p = (pointer)&local_4d0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_4d0,local_538._M_dataplus._M_p,
             local_538._M_dataplus._M_p + local_538._M_string_length);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_4b0 + (ulong)local_4d8 * 0x18),&local_4d0);
  glu::ShaderProgram::ShaderProgram(&local_f0,renderCtx,(ProgramSources *)local_4b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4d0._M_dataplus._M_p != &local_4d0.field_2) {
    operator_delete(local_4d0._M_dataplus._M_p,local_4d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_538._M_dataplus._M_p != &local_538.field_2) {
    operator_delete(local_538._M_dataplus._M_p,local_538.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_518._M_dataplus._M_p != &local_518.field_2) {
    operator_delete(local_518._M_dataplus._M_p,local_518.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4f8._M_dataplus._M_p != &local_4f8.field_2) {
    operator_delete(local_4f8._M_dataplus._M_p,local_4f8.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_400);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_420);
  lVar3 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_4b0 + lVar3));
    lVar3 = lVar3 + -0x18;
  } while (lVar3 != -0x18);
  local_4b0._0_8_ = local_4a0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_4b0,
             "Link error is generated if compute shader exceeds GL_MAX_COMPUTE_UNIFORM_COMPONENTS.",
             "");
  NegativeTestContext::beginSection(ctx,(string *)local_4b0);
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4b0._0_8_ !=
      local_4a0) {
    operator_delete((void *)local_4b0._0_8_,(ulong)(local_4a0[0]._M_dataplus._M_p + 1));
  }
  verifyLinkError(ctx,&local_f0);
  NegativeTestContext::endSection(ctx);
  glu::ShaderProgram::~ShaderProgram(&local_f0);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3e0);
  std::ios_base::~ios_base((ios_base *)(local_3e0 + 0x70));
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_268);
  std::ios_base::~ios_base((ios_base *)(local_268 + 0x70));
  return;
}

Assistant:

void exceed_uniform_components_limit (NegativeTestContext& ctx)
{
	const int			limit = getResourceLimit(ctx, GL_MAX_COMPUTE_UNIFORM_COMPONENTS);
	std::ostringstream	shaderDecl;
	std::ostringstream	shaderBody;

	shaderDecl	<< "uniform highp uint u_value[" << limit + 1 << "];\n"
				<< "\n"
				<< "layout(binding = 0) buffer Output {\n"
				<< "    uint values[2];\n"
				<< "} sb_out;\n";

	shaderBody << "    sb_out.values[0] = u_value[" << limit << "];\n";
	shaderBody << "    sb_out.values[1] = u_value[0];\n";

	glu::ShaderProgram	program(ctx.getRenderContext(), glu::ProgramSources()
			<< glu::ComputeSource(generateComputeShader(ctx, shaderDecl.str(), shaderBody.str())));

	ctx.beginSection("Link error is generated if compute shader exceeds GL_MAX_COMPUTE_UNIFORM_COMPONENTS.");
	verifyLinkError(ctx, program);
	ctx.endSection();
}